

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_15::ConsoleReporter::printHelp(ConsoleReporter *this)

{
  ostream *poVar1;
  Whitespace local_c0;
  Whitespace local_bc;
  Whitespace local_b8;
  Whitespace local_b4;
  Whitespace local_b0;
  Whitespace local_ac;
  Whitespace local_a8;
  Whitespace local_a4;
  Whitespace local_a0;
  Whitespace local_9c;
  Whitespace local_98;
  Whitespace local_94;
  Whitespace local_90;
  Whitespace local_8c;
  Whitespace local_88;
  Whitespace local_84;
  Whitespace local_80;
  Whitespace local_7c;
  Whitespace local_78;
  Whitespace local_74;
  Whitespace local_70;
  Whitespace local_6c;
  Whitespace local_68;
  Whitespace local_64;
  Whitespace local_60;
  Whitespace local_5c;
  Whitespace local_58;
  Whitespace local_54;
  Whitespace local_50;
  Whitespace local_4c;
  Whitespace local_48;
  Whitespace local_44;
  Whitespace local_40;
  Whitespace local_3c;
  Whitespace local_38;
  Whitespace local_34;
  Whitespace local_30;
  Whitespace local_2c;
  Whitespace local_28;
  Whitespace local_24;
  Whitespace local_20;
  Whitespace local_1c;
  Whitespace local_18;
  int local_14;
  ConsoleReporter *pCStack_10;
  int sizePrefixDisplay;
  ConsoleReporter *this_local;
  
  local_14 = 0;
  pCStack_10 = this;
  printVersion(this);
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<(poVar1,None);
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"boolean values: \"1/on/yes/true\" or \"0/off/no/false\"\n");
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"filter  values: \"str1,str2,str3\" (comma separated strings)\n");
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<(poVar1,None);
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"filters use wildcards for matching strings\n");
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"something passes a filter if any of the strings in a filter matches\n");
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<(poVar1,None);
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"dt-\" PREFIX!!!\n"
                 );
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<(poVar1,None);
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"Query flags - the program quits after them. Available:\n\n");
  poVar1 = std::operator<<(this->s," -?,   --help, -h                      ");
  Whitespace::Whitespace(&local_18,0);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_18);
  std::operator<<(poVar1,"prints this message\n");
  poVar1 = std::operator<<(this->s," -v,   --version                       ");
  Whitespace::Whitespace(&local_1c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_1c);
  std::operator<<(poVar1,"prints the version\n");
  poVar1 = std::operator<<(this->s," -c,   --count                         ");
  Whitespace::Whitespace(&local_20,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_20);
  std::operator<<(poVar1,"prints the number of matching tests\n");
  poVar1 = std::operator<<(this->s," -ltc, --list-test-cases               ");
  Whitespace::Whitespace(&local_24,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_24);
  std::operator<<(poVar1,"lists all matching tests by name\n");
  poVar1 = std::operator<<(this->s," -lts, --list-test-suites              ");
  Whitespace::Whitespace(&local_28,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_28);
  std::operator<<(poVar1,"lists all matching test suites\n");
  poVar1 = std::operator<<(this->s," -lr,  --list-reporters                ");
  Whitespace::Whitespace(&local_2c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_2c);
  std::operator<<(poVar1,"lists all registered reporters\n\n");
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"The available <int>/<string> options/filters are:\n\n");
  poVar1 = std::operator<<(this->s," -tc,  --test-case=<filters>           ");
  Whitespace::Whitespace(&local_30,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_30);
  std::operator<<(poVar1,"filters     tests by their name\n");
  poVar1 = std::operator<<(this->s," -tce, --test-case-exclude=<filters>   ");
  Whitespace::Whitespace(&local_34,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_34);
  std::operator<<(poVar1,"filters OUT tests by their name\n");
  poVar1 = std::operator<<(this->s," -sf,  --source-file=<filters>         ");
  Whitespace::Whitespace(&local_38,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_38);
  std::operator<<(poVar1,"filters     tests by their file\n");
  poVar1 = std::operator<<(this->s," -sfe, --source-file-exclude=<filters> ");
  Whitespace::Whitespace(&local_3c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_3c);
  std::operator<<(poVar1,"filters OUT tests by their file\n");
  poVar1 = std::operator<<(this->s," -ts,  --test-suite=<filters>          ");
  Whitespace::Whitespace(&local_40,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_40);
  std::operator<<(poVar1,"filters     tests by their test suite\n");
  poVar1 = std::operator<<(this->s," -tse, --test-suite-exclude=<filters>  ");
  Whitespace::Whitespace(&local_44,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_44);
  std::operator<<(poVar1,"filters OUT tests by their test suite\n");
  poVar1 = std::operator<<(this->s," -sc,  --subcase=<filters>             ");
  Whitespace::Whitespace(&local_48,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_48);
  std::operator<<(poVar1,"filters     subcases by their name\n");
  poVar1 = std::operator<<(this->s," -sce, --subcase-exclude=<filters>     ");
  Whitespace::Whitespace(&local_4c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_4c);
  std::operator<<(poVar1,"filters OUT subcases by their name\n");
  poVar1 = std::operator<<(this->s," -r,   --reporters=<filters>           ");
  Whitespace::Whitespace(&local_50,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_50);
  std::operator<<(poVar1,"reporters to use (console is default)\n");
  poVar1 = std::operator<<(this->s," -o,   --out=<string>                  ");
  Whitespace::Whitespace(&local_54,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_54);
  std::operator<<(poVar1,"output filename\n");
  poVar1 = std::operator<<(this->s," -ob,  --order-by=<string>             ");
  Whitespace::Whitespace(&local_58,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_58);
  std::operator<<(poVar1,"how the tests should be ordered\n");
  poVar1 = this->s;
  Whitespace::Whitespace(&local_5c,local_14 * 3);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_5c);
  std::operator<<(poVar1,
                  "                                       <string> - [file/suite/name/rand/none]\n")
  ;
  poVar1 = std::operator<<(this->s," -rs,  --rand-seed=<int>               ");
  Whitespace::Whitespace(&local_60,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_60);
  std::operator<<(poVar1,"seed for random ordering\n");
  poVar1 = std::operator<<(this->s," -f,   --first=<int>                   ");
  Whitespace::Whitespace(&local_64,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_64);
  std::operator<<(poVar1,"the first test passing the filters to\n");
  poVar1 = this->s;
  Whitespace::Whitespace(&local_68,local_14 * 3);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_68);
  std::operator<<(poVar1,
                  "                                       execute - for range-based execution\n");
  poVar1 = std::operator<<(this->s," -l,   --last=<int>                    ");
  Whitespace::Whitespace(&local_6c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_6c);
  std::operator<<(poVar1,"the last test passing the filters to\n");
  poVar1 = this->s;
  Whitespace::Whitespace(&local_70,local_14 * 3);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_70);
  std::operator<<(poVar1,
                  "                                       execute - for range-based execution\n");
  poVar1 = std::operator<<(this->s," -aa,  --abort-after=<int>             ");
  Whitespace::Whitespace(&local_74,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_74);
  std::operator<<(poVar1,"stop after <int> failed assertions\n");
  poVar1 = std::operator<<(this->s," -scfl,--subcase-filter-levels=<int>   ");
  Whitespace::Whitespace(&local_78,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_78);
  std::operator<<(poVar1,"apply filters for the first <int> levels\n");
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"\n[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,
                  "Bool options - can be used like flags and true is assumed. Available:\n\n");
  poVar1 = std::operator<<(this->s," -s,   --success=<bool>                ");
  Whitespace::Whitespace(&local_7c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_7c);
  std::operator<<(poVar1,"include successful assertions in output\n");
  poVar1 = std::operator<<(this->s," -cs,  --case-sensitive=<bool>         ");
  Whitespace::Whitespace(&local_80,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_80);
  std::operator<<(poVar1,"filters being treated as case sensitive\n");
  poVar1 = std::operator<<(this->s," -e,   --exit=<bool>                   ");
  Whitespace::Whitespace(&local_84,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_84);
  std::operator<<(poVar1,"exits after the tests finish\n");
  poVar1 = std::operator<<(this->s," -d,   --duration=<bool>               ");
  Whitespace::Whitespace(&local_88,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_88);
  std::operator<<(poVar1,"prints the time duration of each test\n");
  poVar1 = std::operator<<(this->s," -m,   --minimal=<bool>                ");
  Whitespace::Whitespace(&local_8c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_8c);
  std::operator<<(poVar1,"minimal console output (only failures)\n");
  poVar1 = std::operator<<(this->s," -q,   --quiet=<bool>                  ");
  Whitespace::Whitespace(&local_90,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_90);
  std::operator<<(poVar1,"no console output\n");
  poVar1 = std::operator<<(this->s," -nt,  --no-throw=<bool>               ");
  Whitespace::Whitespace(&local_94,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_94);
  std::operator<<(poVar1,"skips exceptions-related assert checks\n");
  poVar1 = std::operator<<(this->s," -ne,  --no-exitcode=<bool>            ");
  Whitespace::Whitespace(&local_98,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_98);
  std::operator<<(poVar1,"returns (or exits) always with success\n");
  poVar1 = std::operator<<(this->s," -nr,  --no-run=<bool>                 ");
  Whitespace::Whitespace(&local_9c,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_9c);
  std::operator<<(poVar1,"skips all runtime doctest operations\n");
  poVar1 = std::operator<<(this->s," -ni,  --no-intro=<bool>               ");
  Whitespace::Whitespace(&local_a0,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_a0);
  std::operator<<(poVar1,"omit the framework intro in the output\n");
  poVar1 = std::operator<<(this->s," -nv,  --no-version=<bool>             ");
  Whitespace::Whitespace(&local_a4,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_a4);
  std::operator<<(poVar1,"omit the framework version in the output\n");
  poVar1 = std::operator<<(this->s," -nc,  --no-colors=<bool>              ");
  Whitespace::Whitespace(&local_a8,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_a8);
  std::operator<<(poVar1,"disables colors in output\n");
  poVar1 = std::operator<<(this->s," -fc,  --force-colors=<bool>           ");
  Whitespace::Whitespace(&local_ac,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_ac);
  std::operator<<(poVar1,"use colors even when not in a tty\n");
  poVar1 = std::operator<<(this->s," -nb,  --no-breaks=<bool>              ");
  Whitespace::Whitespace(&local_b0,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_b0);
  std::operator<<(poVar1,"disables breakpoints in debuggers\n");
  poVar1 = std::operator<<(this->s," -ns,  --no-skip=<bool>                ");
  Whitespace::Whitespace(&local_b4,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_b4);
  std::operator<<(poVar1,"don\'t skip test cases marked as skip\n");
  poVar1 = std::operator<<(this->s," -gfl, --gnu-file-line=<bool>          ");
  Whitespace::Whitespace(&local_b8,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_b8);
  std::operator<<(poVar1,":n: vs (n): for line numbers in output\n");
  poVar1 = std::operator<<(this->s," -npf, --no-path-filenames=<bool>      ");
  Whitespace::Whitespace(&local_bc,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_bc);
  std::operator<<(poVar1,"only filenames and no paths in output\n");
  poVar1 = std::operator<<(this->s," -nln, --no-line-numbers=<bool>        ");
  Whitespace::Whitespace(&local_c0,local_14);
  poVar1 = anon_unknown_15::operator<<(poVar1,&local_c0);
  std::operator<<(poVar1,"0 instead of real line numbers in output\n");
  poVar1 = Color::operator<<(this->s,Cyan);
  poVar1 = std::operator<<(poVar1,"\n[doctest] ");
  Color::operator<<(poVar1,None);
  std::operator<<(this->s,"for more information visit the project documentation\n\n");
  return;
}

Assistant:

void printHelp() {
            int sizePrefixDisplay = static_cast<int>(strlen(DOCTEST_OPTIONS_PREFIX_DISPLAY));
            printVersion();
            // clang-format off
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "boolean values: \"1/on/yes/true\" or \"0/off/no/false\"\n";
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "filter  values: \"str1,str2,str3\" (comma separated strings)\n";
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "filters use wildcards for matching strings\n";
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "something passes a filter if any of the strings in a filter matches\n";
#ifndef DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"" DOCTEST_CONFIG_OPTIONS_PREFIX "\" PREFIX!!!\n";
#endif
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "Query flags - the program quits after them. Available:\n\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "?,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "help, -" DOCTEST_OPTIONS_PREFIX_DISPLAY "h                      "
              << Whitespace(sizePrefixDisplay*0) <<  "prints this message\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "v,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "version                       "
              << Whitespace(sizePrefixDisplay*1) << "prints the version\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "c,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "count                         "
              << Whitespace(sizePrefixDisplay*1) << "prints the number of matching tests\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ltc, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "list-test-cases               "
              << Whitespace(sizePrefixDisplay*1) << "lists all matching tests by name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "lts, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "list-test-suites              "
              << Whitespace(sizePrefixDisplay*1) << "lists all matching test suites\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "lr,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "list-reporters                "
              << Whitespace(sizePrefixDisplay*1) << "lists all registered reporters\n\n";
            // ================================================================================== << 79
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "The available <int>/<string> options/filters are:\n\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "tc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-case=<filters>           "
              << Whitespace(sizePrefixDisplay*1) << "filters     tests by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "tce, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-case-exclude=<filters>   "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT tests by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sf,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "source-file=<filters>         "
              << Whitespace(sizePrefixDisplay*1) << "filters     tests by their file\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sfe, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "source-file-exclude=<filters> "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT tests by their file\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ts,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-suite=<filters>          "
              << Whitespace(sizePrefixDisplay*1) << "filters     tests by their test suite\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "tse, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-suite-exclude=<filters>  "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT tests by their test suite\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "subcase=<filters>             "
              << Whitespace(sizePrefixDisplay*1) << "filters     subcases by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sce, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "subcase-exclude=<filters>     "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT subcases by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "r,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "reporters=<filters>           "
              << Whitespace(sizePrefixDisplay*1) << "reporters to use (console is default)\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "o,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "out=<string>                  "
              << Whitespace(sizePrefixDisplay*1) << "output filename\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ob,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "order-by=<string>             "
              << Whitespace(sizePrefixDisplay*1) << "how the tests should be ordered\n";
            s << Whitespace(sizePrefixDisplay*3) << "                                       <string> - [file/suite/name/rand/none]\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "rs,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "rand-seed=<int>               "
              << Whitespace(sizePrefixDisplay*1) << "seed for random ordering\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "f,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "first=<int>                   "
              << Whitespace(sizePrefixDisplay*1) << "the first test passing the filters to\n";
            s << Whitespace(sizePrefixDisplay*3) << "                                       execute - for range-based execution\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "l,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "last=<int>                    "
              << Whitespace(sizePrefixDisplay*1) << "the last test passing the filters to\n";
            s << Whitespace(sizePrefixDisplay*3) << "                                       execute - for range-based execution\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "aa,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "abort-after=<int>             "
              << Whitespace(sizePrefixDisplay*1) << "stop after <int> failed assertions\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "scfl,--" DOCTEST_OPTIONS_PREFIX_DISPLAY "subcase-filter-levels=<int>   "
              << Whitespace(sizePrefixDisplay*1) << "apply filters for the first <int> levels\n";
            s << Color::Cyan << "\n[doctest] " << Color::None;
            s << "Bool options - can be used like flags and true is assumed. Available:\n\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "s,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "success=<bool>                "
              << Whitespace(sizePrefixDisplay*1) << "include successful assertions in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "cs,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "case-sensitive=<bool>         "
              << Whitespace(sizePrefixDisplay*1) << "filters being treated as case sensitive\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "e,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "exit=<bool>                   "
              << Whitespace(sizePrefixDisplay*1) << "exits after the tests finish\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "d,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "duration=<bool>               "
              << Whitespace(sizePrefixDisplay*1) << "prints the time duration of each test\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "m,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "minimal=<bool>                "
              << Whitespace(sizePrefixDisplay*1) << "minimal console output (only failures)\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "q,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "quiet=<bool>                  "
              << Whitespace(sizePrefixDisplay*1) << "no console output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nt,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-throw=<bool>               "
              << Whitespace(sizePrefixDisplay*1) << "skips exceptions-related assert checks\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ne,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-exitcode=<bool>            "
              << Whitespace(sizePrefixDisplay*1) << "returns (or exits) always with success\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nr,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-run=<bool>                 "
              << Whitespace(sizePrefixDisplay*1) << "skips all runtime doctest operations\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ni,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-intro=<bool>               "
              << Whitespace(sizePrefixDisplay*1) << "omit the framework intro in the output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nv,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-version=<bool>             "
              << Whitespace(sizePrefixDisplay*1) << "omit the framework version in the output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-colors=<bool>              "
              << Whitespace(sizePrefixDisplay*1) << "disables colors in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "fc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "force-colors=<bool>           "
              << Whitespace(sizePrefixDisplay*1) << "use colors even when not in a tty\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nb,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-breaks=<bool>              "
              << Whitespace(sizePrefixDisplay*1) << "disables breakpoints in debuggers\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ns,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-skip=<bool>                "
              << Whitespace(sizePrefixDisplay*1) << "don't skip test cases marked as skip\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "gfl, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "gnu-file-line=<bool>          "
              << Whitespace(sizePrefixDisplay*1) << ":n: vs (n): for line numbers in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "npf, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-path-filenames=<bool>      "
              << Whitespace(sizePrefixDisplay*1) << "only filenames and no paths in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nln, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-line-numbers=<bool>        "
              << Whitespace(sizePrefixDisplay*1) << "0 instead of real line numbers in output\n";
            // ================================================================================== << 79
            // clang-format on

            s << Color::Cyan << "\n[doctest] " << Color::None;
            s << "for more information visit the project documentation\n\n";
        }